

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_pdu.cc
# Opt level: O2

ssize_t __thiscall
assembler::TransportPDU::read(TransportPDU *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer puVar1;
  size_type remaining;
  void *__n;
  ulong uVar2;
  ulong __n_00;
  undefined4 in_register_00000034;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (long)(this->header).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->header).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < 6) {
    __n = (void *)(6 - uVar3);
    if (__buf <= (void *)(6 - uVar3)) {
      __n = __buf;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->header,(long)__n + uVar3);
    memcpy((this->header).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + uVar3,(void *)CONCAT44(in_register_00000034,__fd),
           (size_t)__n);
  }
  else {
    __n = (void *)0x0;
  }
  uVar3 = (long)__buf - (long)__n;
  if (__n <= __buf && uVar3 != 0) {
    puVar1 = (this->header).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (ulong)((uint)puVar1[5] + (uint)puVar1[4] * 0x100 + 1 & 0xffff);
    __n_00 = uVar2 - uVar4;
    if (uVar4 <= uVar2 && __n_00 != 0) {
      if (uVar3 < __n_00) {
        __n_00 = uVar3;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data,__n_00 + uVar4)
      ;
      memcpy((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + uVar4,
             (void *)((long)CONCAT44(in_register_00000034,__fd) + (long)__n),__n_00);
      __n = (void *)((long)__n + __n_00);
    }
  }
  return (ssize_t)__n;
}

Assistant:

size_t TransportPDU::read(const uint8_t* buf, size_t len) {
  size_t nread = 0;

  // Read remaining header
  if (header.size() < headerBytes) {
    auto remaining = headerBytes - header.size();
    auto hpos = header.size();
    auto hread = std::min(remaining, (len-nread));
    header.resize(hpos + hread);
    memcpy(&header[hpos], &buf[nread], hread);
    nread += hread;
  }

  // Read remaining user data (if there is more data)
  if (nread < len) {
    if (data.size() < length()) {
      auto remaining = length() - data.size();
      auto dpos = data.size();
      auto dread = std::min(remaining, (len-nread));
      data.resize(dpos + dread);
      memcpy(&data[dpos], &buf[nread], dread);
      nread += dread;
    }
  }

  return nread;
}